

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_avx_functor::binary_op_rpow>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  int in_ECX;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  __m128 _outp_1;
  __m128 _p_1;
  __m128 _b;
  __m256 _outp;
  __m256 _p;
  __m256 _b_avx;
  int i;
  int size;
  binary_op_rpow op;
  __m256 pow2n;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx;
  __m256 tmp_1;
  __m256 y;
  __m256 z;
  __m256 tmp;
  __m256 mask;
  __m256 e;
  __m256 invalid_mask;
  __m256 one;
  __m256i imm0;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  __m256i ret_1;
  __m128i y2;
  __m128i y1;
  __m128i x2_1;
  __m128i x1_1;
  v4sf pow2n_1;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_3;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_3;
  v4sf y_2;
  v4sf z_1;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_2;
  v4si emm0;
  int local_27b4;
  undefined8 *local_27a0;
  undefined8 *local_2790;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  float local_2660;
  float fStack_265c;
  float fStack_2658;
  float fStack_2654;
  float fStack_2650;
  float fStack_264c;
  float fStack_2648;
  float local_2640;
  float fStack_263c;
  float fStack_2638;
  float fStack_2634;
  float fStack_2630;
  float fStack_262c;
  float fStack_2628;
  undefined4 uStack_2624;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined1 local_2580 [8];
  float fStack_2578;
  float fStack_2574;
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  undefined1 local_2540 [8];
  float fStack_2538;
  float fStack_2534;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  undefined1 local_23a0 [8];
  float fStack_2398;
  float fStack_2394;
  float fStack_2390;
  float fStack_238c;
  float fStack_2388;
  float fStack_2384;
  undefined1 local_2320 [8];
  float fStack_2318;
  float fStack_2314;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined1 local_22a0 [8];
  float fStack_2298;
  float fStack_2294;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  float local_2280;
  float fStack_227c;
  float fStack_2278;
  float fStack_2274;
  float fStack_2270;
  float fStack_226c;
  float fStack_2268;
  float fStack_2264;
  float local_2240;
  float fStack_223c;
  float fStack_2238;
  float fStack_2234;
  float fStack_2230;
  float fStack_222c;
  float fStack_2228;
  float fStack_2224;
  float local_2220;
  float fStack_221c;
  float fStack_2218;
  float fStack_2214;
  float fStack_2210;
  float fStack_220c;
  float fStack_2208;
  float fStack_2204;
  float local_21e0;
  float fStack_21dc;
  float fStack_21d8;
  float fStack_21d4;
  float fStack_21d0;
  float fStack_21cc;
  float fStack_21c8;
  float fStack_21c4;
  float local_1ee0;
  float fStack_1edc;
  float fStack_1ed8;
  float fStack_1ed4;
  float fStack_1ed0;
  float fStack_1ecc;
  float fStack_1ec8;
  float local_1580;
  float fStack_157c;
  float fStack_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float fStack_1568;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined8 local_e00;
  undefined8 uStack_df8;
  float local_cc0;
  float fStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  float local_cb0;
  float fStack_cac;
  float fStack_ca8;
  float fStack_ca4;
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 local_c50;
  undefined8 uStack_c48;
  undefined8 local_c30;
  undefined8 uStack_c28;
  float local_bc0;
  float fStack_bbc;
  float fStack_bb8;
  float fStack_bb4;
  float local_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  float local_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a60;
  undefined8 uStack_a58;
  float local_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  float local_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  
  local_27b4 = 0;
  uVar1 = *in_RSI;
  auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
  auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
  auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
  uStack_26f0 = auVar4._0_8_;
  uStack_26e8 = auVar4._8_8_;
  local_27a0 = in_RDX;
  local_2790 = in_RDI;
  for (; local_27b4 + 7 < in_ECX * in_R8D; local_27b4 = local_27b4 + 8) {
    auVar46._16_8_ = uStack_26f0;
    auVar46._0_16_ = auVar5;
    auVar46._24_8_ = uStack_26e8;
    auVar45._16_8_ = uStack_26f0;
    auVar45._0_16_ = auVar5;
    auVar45._24_8_ = uStack_26e8;
    auVar2 = vcmpps_avx(auVar45,ZEXT1632(ZEXT816(0)),2);
    auVar7._8_8_ = 0x80000000800000;
    auVar7._0_8_ = 0x80000000800000;
    auVar7._16_8_ = 0x80000000800000;
    auVar7._24_8_ = 0x80000000800000;
    auVar6 = vmaxps_avx(auVar46,auVar7);
    auVar4 = vpsrld_avx(auVar6._0_16_,ZEXT416(0x17));
    auVar9 = vpsrld_avx(auVar6._16_16_,ZEXT416(0x17));
    auVar13._8_8_ = 0x807fffff807fffff;
    auVar13._0_8_ = 0x807fffff807fffff;
    auVar13._16_8_ = 0x807fffff807fffff;
    auVar13._24_8_ = 0x807fffff807fffff;
    auVar6 = vandps_avx(auVar6,auVar13);
    auVar20._8_8_ = 0x3f0000003f000000;
    auVar20._0_8_ = 0x3f0000003f000000;
    auVar20._16_8_ = 0x3f0000003f000000;
    auVar20._24_8_ = 0x3f0000003f000000;
    auVar7 = vorps_avx(auVar6,auVar20);
    auVar23._8_8_ = 0x7f0000007f;
    auVar23._0_8_ = 0x7f0000007f;
    auVar4 = vpsubd_avx(auVar4,auVar23);
    auVar22._8_8_ = 0x7f0000007f;
    auVar22._0_8_ = 0x7f0000007f;
    auVar9 = vpsubd_avx(auVar9,auVar22);
    local_e00 = auVar9._0_8_;
    uStack_df8 = auVar9._8_8_;
    auVar21._16_8_ = local_e00;
    auVar21._0_16_ = auVar4;
    auVar21._24_8_ = uStack_df8;
    auVar6 = vcvtdq2ps_avx(auVar21);
    local_21e0 = auVar6._0_4_;
    fStack_21dc = auVar6._4_4_;
    fStack_21d8 = auVar6._8_4_;
    fStack_21d4 = auVar6._12_4_;
    fStack_21d0 = auVar6._16_4_;
    fStack_21cc = auVar6._20_4_;
    fStack_21c8 = auVar6._24_4_;
    fStack_21c4 = auVar6._28_4_;
    local_2320._4_4_ = fStack_21dc + 1.0;
    local_2320._0_4_ = local_21e0 + 1.0;
    fStack_2318 = fStack_21d8 + 1.0;
    fStack_2314 = fStack_21d4 + 1.0;
    uStack_2310._0_4_ = fStack_21d0 + 1.0;
    uStack_2310._4_4_ = fStack_21cc + 1.0;
    uStack_2308._0_4_ = fStack_21c8 + 1.0;
    uStack_2308._4_4_ = fStack_21c4 + 1.0;
    auVar10 = _local_2320;
    auVar3 = vcmpps_avx(auVar7,_DAT_01f8f6e0,1);
    auVar6 = vandps_avx(auVar7,auVar3);
    auVar11._8_8_ = 0x3f8000003f800000;
    auVar11._0_8_ = 0x3f8000003f800000;
    auVar11._16_8_ = 0x3f8000003f800000;
    auVar11._24_8_ = 0x3f8000003f800000;
    auVar7 = vsubps_avx(auVar7,auVar11);
    uStack_2308 = auVar10._24_8_;
    auVar12._8_8_ = 0x3f8000003f800000;
    auVar12._0_8_ = 0x3f8000003f800000;
    auVar12._16_8_ = 0x3f8000003f800000;
    auVar12._24_8_ = 0x3f8000003f800000;
    auVar3 = vandps_avx(auVar12,auVar3);
    auVar10._16_8_ = uStack_2310;
    auVar10._0_16_ = _local_2320;
    auVar10._24_8_ = uStack_2308;
    auVar3 = vsubps_avx(auVar10,auVar3);
    local_2220 = auVar7._0_4_;
    fStack_221c = auVar7._4_4_;
    fStack_2218 = auVar7._8_4_;
    fStack_2214 = auVar7._12_4_;
    fStack_2210 = auVar7._16_4_;
    fStack_220c = auVar7._20_4_;
    fStack_2208 = auVar7._24_4_;
    fStack_2204 = auVar7._28_4_;
    local_2240 = auVar6._0_4_;
    fStack_223c = auVar6._4_4_;
    fStack_2238 = auVar6._8_4_;
    fStack_2234 = auVar6._12_4_;
    fStack_2230 = auVar6._16_4_;
    fStack_222c = auVar6._20_4_;
    fStack_2228 = auVar6._24_4_;
    fStack_2224 = auVar6._28_4_;
    local_2220 = local_2220 + local_2240;
    fStack_221c = fStack_221c + fStack_223c;
    fStack_2218 = fStack_2218 + fStack_2238;
    fStack_2214 = fStack_2214 + fStack_2234;
    fStack_2210 = fStack_2210 + fStack_2230;
    fStack_220c = fStack_220c + fStack_222c;
    fStack_2208 = fStack_2208 + fStack_2228;
    fStack_2204 = fStack_2204 + fStack_2224;
    local_1ee0 = auVar3._0_4_;
    fStack_1edc = auVar3._4_4_;
    fStack_1ed8 = auVar3._8_4_;
    fStack_1ed4 = auVar3._12_4_;
    fStack_1ed0 = auVar3._16_4_;
    fStack_1ecc = auVar3._20_4_;
    fStack_1ec8 = auVar3._24_4_;
    local_23a0._4_4_ =
         fStack_1edc * -0.00021219444 +
         ((((((((fStack_221c * 0.070376836 + -0.1151461) * fStack_221c + 0.116769984) * fStack_221c
              + -0.12420141) * fStack_221c + 0.14249323) * fStack_221c + -0.16668057) * fStack_221c
           + 0.20000714) * fStack_221c + -0.24999994) * fStack_221c + 0.3333333) * fStack_221c *
         fStack_221c * fStack_221c;
    local_23a0._0_4_ =
         local_1ee0 * -0.00021219444 +
         ((((((((local_2220 * 0.070376836 + -0.1151461) * local_2220 + 0.116769984) * local_2220 +
              -0.12420141) * local_2220 + 0.14249323) * local_2220 + -0.16668057) * local_2220 +
           0.20000714) * local_2220 + -0.24999994) * local_2220 + 0.3333333) * local_2220 *
         local_2220 * local_2220;
    fStack_2398 = fStack_1ed8 * -0.00021219444 +
                  ((((((((fStack_2218 * 0.070376836 + -0.1151461) * fStack_2218 + 0.116769984) *
                        fStack_2218 + -0.12420141) * fStack_2218 + 0.14249323) * fStack_2218 +
                     -0.16668057) * fStack_2218 + 0.20000714) * fStack_2218 + -0.24999994) *
                   fStack_2218 + 0.3333333) * fStack_2218 * fStack_2218 * fStack_2218;
    fStack_2394 = fStack_1ed4 * -0.00021219444 +
                  ((((((((fStack_2214 * 0.070376836 + -0.1151461) * fStack_2214 + 0.116769984) *
                        fStack_2214 + -0.12420141) * fStack_2214 + 0.14249323) * fStack_2214 +
                     -0.16668057) * fStack_2214 + 0.20000714) * fStack_2214 + -0.24999994) *
                   fStack_2214 + 0.3333333) * fStack_2214 * fStack_2214 * fStack_2214;
    fStack_2390 = fStack_1ed0 * -0.00021219444 +
                  ((((((((fStack_2210 * 0.070376836 + -0.1151461) * fStack_2210 + 0.116769984) *
                        fStack_2210 + -0.12420141) * fStack_2210 + 0.14249323) * fStack_2210 +
                     -0.16668057) * fStack_2210 + 0.20000714) * fStack_2210 + -0.24999994) *
                   fStack_2210 + 0.3333333) * fStack_2210 * fStack_2210 * fStack_2210;
    fStack_238c = fStack_1ecc * -0.00021219444 +
                  ((((((((fStack_220c * 0.070376836 + -0.1151461) * fStack_220c + 0.116769984) *
                        fStack_220c + -0.12420141) * fStack_220c + 0.14249323) * fStack_220c +
                     -0.16668057) * fStack_220c + 0.20000714) * fStack_220c + -0.24999994) *
                   fStack_220c + 0.3333333) * fStack_220c * fStack_220c * fStack_220c;
    fStack_2388 = fStack_1ec8 * -0.00021219444 +
                  ((((((((fStack_2208 * 0.070376836 + -0.1151461) * fStack_2208 + 0.116769984) *
                        fStack_2208 + -0.12420141) * fStack_2208 + 0.14249323) * fStack_2208 +
                     -0.16668057) * fStack_2208 + 0.20000714) * fStack_2208 + -0.24999994) *
                   fStack_2208 + 0.3333333) * fStack_2208 * fStack_2208 * fStack_2208;
    fStack_2384 = fStack_2204 + 0.3333333 + -0.00021219444;
    auVar15._4_4_ = fStack_221c * fStack_221c * 0.5;
    auVar15._0_4_ = local_2220 * local_2220 * 0.5;
    auVar15._8_4_ = fStack_2218 * fStack_2218 * 0.5;
    auVar15._12_4_ = fStack_2214 * fStack_2214 * 0.5;
    auVar15._16_4_ = fStack_2210 * fStack_2210 * 0.5;
    auVar15._20_4_ = fStack_220c * fStack_220c * 0.5;
    auVar15._24_4_ = fStack_2208 * fStack_2208 * 0.5;
    auVar15._28_4_ = fStack_2204;
    auVar6 = vsubps_avx(_local_23a0,auVar15);
    local_2280 = auVar6._0_4_;
    fStack_227c = auVar6._4_4_;
    fStack_2278 = auVar6._8_4_;
    fStack_2274 = auVar6._12_4_;
    fStack_2270 = auVar6._16_4_;
    fStack_226c = auVar6._20_4_;
    fStack_2268 = auVar6._24_4_;
    fStack_2264 = auVar6._28_4_;
    local_22a0._4_4_ = fStack_1edc * 0.6933594 + fStack_221c + fStack_227c;
    local_22a0._0_4_ = local_1ee0 * 0.6933594 + local_2220 + local_2280;
    fStack_2298 = fStack_1ed8 * 0.6933594 + fStack_2218 + fStack_2278;
    fStack_2294 = fStack_1ed4 * 0.6933594 + fStack_2214 + fStack_2274;
    uStack_2290._0_4_ = fStack_1ed0 * 0.6933594 + fStack_2210 + fStack_2270;
    uStack_2290._4_4_ = fStack_1ecc * 0.6933594 + fStack_220c + fStack_226c;
    uStack_2288._0_4_ = fStack_1ec8 * 0.6933594 + fStack_2208 + fStack_2268;
    uStack_2288._4_4_ = fStack_2204 + fStack_2264 + 0.6933594;
    auVar6 = _local_22a0;
    uStack_2288 = auVar6._24_8_;
    auVar19._16_8_ = uStack_2290;
    auVar19._0_16_ = _local_22a0;
    auVar19._24_8_ = uStack_2288;
    auVar6 = vorps_avx(auVar19,auVar2);
    local_2640 = (float)*local_2790;
    fStack_263c = (float)((ulong)*local_2790 >> 0x20);
    fStack_2638 = (float)local_2790[1];
    fStack_2634 = (float)((ulong)local_2790[1] >> 0x20);
    fStack_2630 = (float)local_2790[2];
    fStack_262c = (float)((ulong)local_2790[2] >> 0x20);
    fStack_2628 = (float)local_2790[3];
    uStack_2624 = (undefined4)((ulong)local_2790[3] >> 0x20);
    local_2660 = auVar6._0_4_;
    fStack_265c = auVar6._4_4_;
    fStack_2658 = auVar6._8_4_;
    fStack_2654 = auVar6._12_4_;
    fStack_2650 = auVar6._16_4_;
    fStack_264c = auVar6._20_4_;
    fStack_2648 = auVar6._24_4_;
    local_2540._4_4_ = fStack_263c * fStack_265c;
    local_2540._0_4_ = local_2640 * local_2660;
    fStack_2538 = fStack_2638 * fStack_2658;
    fStack_2534 = fStack_2634 * fStack_2654;
    uStack_2530._0_4_ = fStack_2630 * fStack_2650;
    uStack_2530._4_4_ = fStack_262c * fStack_264c;
    uStack_2528._0_4_ = fStack_2628 * fStack_2648;
    uStack_2528._4_4_ = uStack_2624;
    auVar6 = _local_2540;
    uStack_2528 = auVar6._24_8_;
    auVar2._16_8_ = uStack_2530;
    auVar2._0_16_ = _local_2540;
    auVar2._24_8_ = uStack_2528;
    auVar6._8_8_ = 0x42b0c0a542b0c0a5;
    auVar6._0_8_ = 0x42b0c0a542b0c0a5;
    auVar6._16_8_ = 0x42b0c0a542b0c0a5;
    auVar6._24_8_ = 0x42b0c0a542b0c0a5;
    auVar6 = vminps_avx(auVar2,auVar6);
    auVar3._8_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar3._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar3._16_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar3._24_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar3 = vmaxps_avx(auVar6,auVar3);
    local_1580 = auVar3._0_4_;
    fStack_157c = auVar3._4_4_;
    fStack_1578 = auVar3._8_4_;
    fStack_1574 = auVar3._12_4_;
    fStack_1570 = auVar3._16_4_;
    fStack_156c = auVar3._20_4_;
    fStack_1568 = auVar3._24_4_;
    local_2580._4_4_ = fStack_157c * 1.442695 + 0.5;
    local_2580._0_4_ = local_1580 * 1.442695 + 0.5;
    fStack_2578 = fStack_1578 * 1.442695 + 0.5;
    fStack_2574 = fStack_1574 * 1.442695 + 0.5;
    fStack_2570 = fStack_1570 * 1.442695 + 0.5;
    fStack_256c = fStack_156c * 1.442695 + 0.5;
    fStack_2568 = fStack_1568 * 1.442695 + 0.5;
    uStack_2564 = 0x3ff8aa3b;
    auVar2 = vroundps_avx(_local_2580,1);
    auVar6 = vcmpps_avx(_local_2580,auVar2,1);
    auVar14._8_8_ = 0x3f8000003f800000;
    auVar14._0_8_ = 0x3f8000003f800000;
    auVar14._16_8_ = 0x3f8000003f800000;
    auVar14._24_8_ = 0x3f8000003f800000;
    auVar6 = vandps_avx(auVar6,auVar14);
    auVar6 = vsubps_avx(auVar2,auVar6);
    local_12a0 = auVar6._0_4_;
    fStack_129c = auVar6._4_4_;
    fStack_1298 = auVar6._8_4_;
    fStack_1294 = auVar6._12_4_;
    fStack_1290 = auVar6._16_4_;
    fStack_128c = auVar6._20_4_;
    fStack_1288 = auVar6._24_4_;
    fStack_1284 = auVar6._28_4_;
    auVar17._4_4_ = fStack_129c * 0.6933594;
    auVar17._0_4_ = local_12a0 * 0.6933594;
    auVar17._8_4_ = fStack_1298 * 0.6933594;
    auVar17._12_4_ = fStack_1294 * 0.6933594;
    auVar17._16_4_ = fStack_1290 * 0.6933594;
    auVar17._20_4_ = fStack_128c * 0.6933594;
    auVar17._24_4_ = fStack_1288 * 0.6933594;
    auVar17._28_4_ = fStack_1284;
    auVar6 = vsubps_avx(auVar3,auVar17);
    auVar16._4_4_ = fStack_129c * -0.00021219444;
    auVar16._0_4_ = local_12a0 * -0.00021219444;
    auVar16._8_4_ = fStack_1298 * -0.00021219444;
    auVar16._12_4_ = fStack_1294 * -0.00021219444;
    auVar16._16_4_ = fStack_1290 * -0.00021219444;
    auVar16._20_4_ = fStack_128c * -0.00021219444;
    auVar16._24_4_ = fStack_1288 * -0.00021219444;
    auVar16._28_4_ = fStack_1284;
    auVar6 = vsubps_avx(auVar6,auVar16);
    local_2440 = auVar6._0_4_;
    fStack_243c = auVar6._4_4_;
    fStack_2438 = auVar6._8_4_;
    fStack_2434 = auVar6._12_4_;
    fStack_2430 = auVar6._16_4_;
    fStack_242c = auVar6._20_4_;
    fStack_2428 = auVar6._24_4_;
    fStack_2424 = auVar6._28_4_;
    local_25a0 = CONCAT44((int)fStack_129c,(int)local_12a0);
    uStack_2598 = CONCAT44((int)fStack_1294,(int)fStack_1298);
    uStack_2590 = CONCAT44((int)fStack_128c,(int)fStack_1290);
    uStack_2588 = CONCAT44((int)fStack_1284,(int)fStack_1288);
    auVar18._8_8_ = uStack_2598;
    auVar18._0_8_ = local_25a0;
    auVar4._8_8_ = 0x7f0000007f;
    auVar4._0_8_ = 0x7f0000007f;
    auVar4 = vpaddd_avx(auVar18,auVar4);
    auVar8._8_8_ = uStack_2588;
    auVar8._0_8_ = uStack_2590;
    auVar9._8_8_ = 0x7f0000007f;
    auVar9._0_8_ = 0x7f0000007f;
    auVar9 = vpaddd_avx(auVar8,auVar9);
    auVar4 = vpslld_avx(auVar4,ZEXT416(0x17));
    auVar9 = vpslld_avx(auVar9,ZEXT416(0x17));
    local_24a0 = auVar4._0_4_;
    fStack_249c = auVar4._4_4_;
    fStack_2498 = auVar4._8_4_;
    fStack_2494 = auVar4._12_4_;
    fStack_2490 = auVar9._0_4_;
    fStack_248c = auVar9._4_4_;
    fStack_2488 = auVar9._8_4_;
    local_2600 = CONCAT44(((((((fStack_243c * 0.00019875691 + 0.0013981999) * fStack_243c +
                              0.008333452) * fStack_243c + 0.041665796) * fStack_243c + 0.16666666)
                            * fStack_243c + 0.5) * fStack_243c * fStack_243c + fStack_243c + 1.0) *
                          fStack_249c,
                          ((((((local_2440 * 0.00019875691 + 0.0013981999) * local_2440 +
                              0.008333452) * local_2440 + 0.041665796) * local_2440 + 0.16666666) *
                            local_2440 + 0.5) * local_2440 * local_2440 + local_2440 + 1.0) *
                          local_24a0);
    uStack_25f8 = CONCAT44(((((((fStack_2434 * 0.00019875691 + 0.0013981999) * fStack_2434 +
                               0.008333452) * fStack_2434 + 0.041665796) * fStack_2434 + 0.16666666)
                             * fStack_2434 + 0.5) * fStack_2434 * fStack_2434 + fStack_2434 + 1.0) *
                           fStack_2494,
                           ((((((fStack_2438 * 0.00019875691 + 0.0013981999) * fStack_2438 +
                               0.008333452) * fStack_2438 + 0.041665796) * fStack_2438 + 0.16666666)
                             * fStack_2438 + 0.5) * fStack_2438 * fStack_2438 + fStack_2438 + 1.0) *
                           fStack_2498);
    uStack_25f0 = CONCAT44(((((((fStack_242c * 0.00019875691 + 0.0013981999) * fStack_242c +
                               0.008333452) * fStack_242c + 0.041665796) * fStack_242c + 0.16666666)
                             * fStack_242c + 0.5) * fStack_242c * fStack_242c + fStack_242c + 1.0) *
                           fStack_248c,
                           ((((((fStack_2430 * 0.00019875691 + 0.0013981999) * fStack_2430 +
                               0.008333452) * fStack_2430 + 0.041665796) * fStack_2430 + 0.16666666)
                             * fStack_2430 + 0.5) * fStack_2430 * fStack_2430 + fStack_2430 + 1.0) *
                           fStack_2490);
    uStack_25e8 = CONCAT44(fStack_2424 + fStack_2424 + 1.0,
                           ((((((fStack_2428 * 0.00019875691 + 0.0013981999) * fStack_2428 +
                               0.008333452) * fStack_2428 + 0.041665796) * fStack_2428 + 0.16666666)
                             * fStack_2428 + 0.5) * fStack_2428 * fStack_2428 + fStack_2428 + 1.0) *
                           fStack_2488);
    *local_27a0 = local_2600;
    local_27a0[1] = uStack_25f8;
    local_27a0[2] = uStack_25f0;
    local_27a0[3] = uStack_25e8;
    local_2790 = local_2790 + 4;
    local_27a0 = local_27a0 + 4;
  }
  uVar1 = *in_RSI;
  for (; local_27b4 + 3 < in_ECX * in_R8D; local_27b4 = local_27b4 + 4) {
    auVar44._8_8_ = CONCAT44(uVar1,uVar1);
    auVar44._0_8_ = CONCAT44(uVar1,uVar1);
    auVar43._8_8_ = CONCAT44(uVar1,uVar1);
    auVar43._0_8_ = CONCAT44(uVar1,uVar1);
    auVar4 = vcmpps_avx(auVar44,ZEXT816(0),2);
    auVar30._8_8_ = 0x80000000800000;
    auVar30._0_8_ = 0x80000000800000;
    auVar5 = vmaxps_avx(auVar43,auVar30);
    auVar9 = vpsrld_avx(auVar5,ZEXT416(0x17));
    auVar35._8_8_ = 0x807fffff807fffff;
    auVar35._0_8_ = 0x807fffff807fffff;
    auVar5 = vpand_avx(auVar5,auVar35);
    auVar41._8_8_ = 0x3f0000003f000000;
    auVar41._0_8_ = 0x3f0000003f000000;
    auVar8 = vpor_avx(auVar5,auVar41);
    auVar31._8_8_ = 0x7f0000007f;
    auVar31._0_8_ = 0x7f0000007f;
    auVar5 = vpsubd_avx(auVar9,auVar31);
    auVar5 = vcvtdq2ps_avx(auVar5);
    local_a00 = auVar5._0_4_;
    fStack_9fc = auVar5._4_4_;
    fStack_9f8 = auVar5._8_4_;
    fStack_9f4 = auVar5._12_4_;
    local_aa0 = CONCAT44(fStack_9fc + 1.0,local_a00 + 1.0);
    uStack_a98._0_4_ = fStack_9f8 + 1.0;
    uStack_a98._4_4_ = fStack_9f4 + 1.0;
    auVar42._8_8_ = 0x3f3504f33f3504f3;
    auVar42._0_8_ = 0x3f3504f33f3504f3;
    auVar5 = vcmpps_avx(auVar8,auVar42,1);
    auVar9 = vpand_avx(auVar8,auVar5);
    auVar29._8_8_ = 0x3f8000003f800000;
    auVar29._0_8_ = 0x3f8000003f800000;
    auVar8 = vsubps_avx(auVar8,auVar29);
    auVar34._8_8_ = 0x3f8000003f800000;
    auVar34._0_8_ = 0x3f8000003f800000;
    auVar5 = vpand_avx(auVar34,auVar5);
    auVar28._8_8_ = uStack_a98;
    auVar28._0_8_ = local_aa0;
    auVar5 = vsubps_avx(auVar28,auVar5);
    local_a20 = auVar8._0_4_;
    fStack_a1c = auVar8._4_4_;
    fStack_a18 = auVar8._8_4_;
    fStack_a14 = auVar8._12_4_;
    local_a30 = auVar9._0_4_;
    fStack_a2c = auVar9._4_4_;
    fStack_a28 = auVar9._8_4_;
    fStack_a24 = auVar9._12_4_;
    local_a20 = local_a20 + local_a30;
    fStack_a1c = fStack_a1c + fStack_a2c;
    fStack_a18 = fStack_a18 + fStack_a28;
    fStack_a14 = fStack_a14 + fStack_a24;
    local_620 = auVar5._0_4_;
    fStack_61c = auVar5._4_4_;
    fStack_618 = auVar5._8_4_;
    fStack_614 = auVar5._12_4_;
    local_ae0._4_4_ =
         fStack_61c * -0.00021219444 +
         ((((((((fStack_a1c * 0.070376836 + -0.1151461) * fStack_a1c + 0.116769984) * fStack_a1c +
              -0.12420141) * fStack_a1c + 0.14249323) * fStack_a1c + -0.16668057) * fStack_a1c +
           0.20000714) * fStack_a1c + -0.24999994) * fStack_a1c + 0.3333333) * fStack_a1c *
         fStack_a1c * fStack_a1c;
    local_ae0._0_4_ =
         local_620 * -0.00021219444 +
         ((((((((local_a20 * 0.070376836 + -0.1151461) * local_a20 + 0.116769984) * local_a20 +
              -0.12420141) * local_a20 + 0.14249323) * local_a20 + -0.16668057) * local_a20 +
           0.20000714) * local_a20 + -0.24999994) * local_a20 + 0.3333333) * local_a20 *
         local_a20 * local_a20;
    fStack_ad8 = fStack_618 * -0.00021219444 +
                 ((((((((fStack_a18 * 0.070376836 + -0.1151461) * fStack_a18 + 0.116769984) *
                       fStack_a18 + -0.12420141) * fStack_a18 + 0.14249323) * fStack_a18 +
                    -0.16668057) * fStack_a18 + 0.20000714) * fStack_a18 + -0.24999994) * fStack_a18
                 + 0.3333333) * fStack_a18 * fStack_a18 * fStack_a18;
    fStack_ad4 = fStack_614 * -0.00021219444 +
                 ((((((((fStack_a14 * 0.070376836 + -0.1151461) * fStack_a14 + 0.116769984) *
                       fStack_a14 + -0.12420141) * fStack_a14 + 0.14249323) * fStack_a14 +
                    -0.16668057) * fStack_a14 + 0.20000714) * fStack_a14 + -0.24999994) * fStack_a14
                 + 0.3333333) * fStack_a14 * fStack_a14 * fStack_a14;
    auVar37._4_4_ = fStack_a1c * fStack_a1c * 0.5;
    auVar37._0_4_ = local_a20 * local_a20 * 0.5;
    auVar37._8_4_ = fStack_a18 * fStack_a18 * 0.5;
    auVar37._12_4_ = fStack_a14 * fStack_a14 * 0.5;
    auVar5 = vsubps_avx(_local_ae0,auVar37);
    local_a50 = auVar5._0_4_;
    fStack_a4c = auVar5._4_4_;
    fStack_a48 = auVar5._8_4_;
    fStack_a44 = auVar5._12_4_;
    local_a60 = CONCAT44(fStack_61c * 0.6933594 + fStack_a1c + fStack_a4c,
                         local_620 * 0.6933594 + local_a20 + local_a50);
    uStack_a58._0_4_ = fStack_618 * 0.6933594 + fStack_a18 + fStack_a48;
    uStack_a58._4_4_ = fStack_614 * 0.6933594 + fStack_a14 + fStack_a44;
    auVar40._8_8_ = uStack_a58;
    auVar40._0_8_ = local_a60;
    auVar4 = vpor_avx(auVar40,auVar4);
    local_cb0 = (float)*local_2790;
    fStack_cac = (float)((ulong)*local_2790 >> 0x20);
    fStack_ca8 = (float)local_2790[1];
    fStack_ca4 = (float)((ulong)local_2790[1] >> 0x20);
    local_cc0 = auVar4._0_4_;
    fStack_cbc = auVar4._4_4_;
    fStack_cb8 = auVar4._8_4_;
    fStack_cb4 = auVar4._12_4_;
    local_c30 = CONCAT44(fStack_cac * fStack_cbc,local_cb0 * local_cc0);
    uStack_c28._0_4_ = fStack_ca8 * fStack_cb8;
    uStack_c28._4_4_ = fStack_ca4 * fStack_cb4;
    auVar25._8_8_ = uStack_c28;
    auVar25._0_8_ = local_c30;
    auVar24._8_8_ = 0x42b0c0a542b0c0a5;
    auVar24._0_8_ = 0x42b0c0a542b0c0a5;
    auVar4 = vminps_avx(auVar25,auVar24);
    auVar5._8_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar5._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar9 = vmaxps_avx(auVar4,auVar5);
    local_b70 = auVar9._0_4_;
    fStack_b6c = auVar9._4_4_;
    fStack_b68 = auVar9._8_4_;
    fStack_b64 = auVar9._12_4_;
    fVar47 = local_b70 * 1.442695 + 0.5;
    fVar48 = fStack_b6c * 1.442695 + 0.5;
    fVar49 = fStack_b68 * 1.442695 + 0.5;
    fVar50 = fStack_b64 * 1.442695 + 0.5;
    local_c50 = CONCAT44(fVar48,fVar47);
    uStack_c48._0_4_ = fVar49;
    uStack_c48._4_4_ = fVar50;
    local_c60 = CONCAT44((int)fVar48,(int)fVar47);
    uStack_c58._0_4_ = (int)fVar49;
    uStack_c58._4_4_ = (int)fVar50;
    auVar32._8_8_ = uStack_c58;
    auVar32._0_8_ = local_c60;
    auVar5 = vcvtdq2ps_avx(auVar32);
    auVar33._8_8_ = uStack_c48;
    auVar33._0_8_ = local_c50;
    auVar4 = vcmpps_avx(auVar33,auVar5,1);
    auVar36._8_8_ = 0x3f8000003f800000;
    auVar36._0_8_ = 0x3f8000003f800000;
    auVar4 = vpand_avx(auVar4,auVar36);
    auVar4 = vsubps_avx(auVar5,auVar4);
    local_6e0 = auVar4._0_4_;
    fStack_6dc = auVar4._4_4_;
    fStack_6d8 = auVar4._8_4_;
    fStack_6d4 = auVar4._12_4_;
    auVar39._4_4_ = fStack_6dc * 0.6933594;
    auVar39._0_4_ = local_6e0 * 0.6933594;
    auVar39._8_4_ = fStack_6d8 * 0.6933594;
    auVar39._12_4_ = fStack_6d4 * 0.6933594;
    auVar4 = vsubps_avx(auVar9,auVar39);
    auVar38._4_4_ = fStack_6dc * -0.00021219444;
    auVar38._0_4_ = local_6e0 * -0.00021219444;
    auVar38._8_4_ = fStack_6d8 * -0.00021219444;
    auVar38._12_4_ = fStack_6d4 * -0.00021219444;
    auVar4 = vsubps_avx(auVar4,auVar38);
    local_b90 = auVar4._0_4_;
    fStack_b8c = auVar4._4_4_;
    fStack_b88 = auVar4._8_4_;
    fStack_b84 = auVar4._12_4_;
    local_c60 = CONCAT44((int)fStack_6dc,(int)local_6e0);
    uStack_c58._0_4_ = (int)fStack_6d8;
    uStack_c58._4_4_ = (int)fStack_6d4;
    auVar27._8_8_ = uStack_c58;
    auVar27._0_8_ = local_c60;
    auVar26._8_8_ = 0x7f0000007f;
    auVar26._0_8_ = 0x7f0000007f;
    auVar4 = vpaddd_avx(auVar27,auVar26);
    auVar4 = vpslld_avx(auVar4,ZEXT416(0x17));
    local_bc0 = auVar4._0_4_;
    fStack_bbc = auVar4._4_4_;
    fStack_bb8 = auVar4._8_4_;
    fStack_bb4 = auVar4._12_4_;
    local_c90 = CONCAT44(((((((fStack_b8c * 0.00019875691 + 0.0013981999) * fStack_b8c + 0.008333452
                             ) * fStack_b8c + 0.041665796) * fStack_b8c + 0.16666666) * fStack_b8c +
                          0.5) * fStack_b8c * fStack_b8c + fStack_b8c + 1.0) * fStack_bbc,
                         ((((((local_b90 * 0.00019875691 + 0.0013981999) * local_b90 + 0.008333452)
                             * local_b90 + 0.041665796) * local_b90 + 0.16666666) * local_b90 + 0.5)
                          * local_b90 * local_b90 + local_b90 + 1.0) * local_bc0);
    uStack_c88 = CONCAT44(((((((fStack_b84 * 0.00019875691 + 0.0013981999) * fStack_b84 +
                              0.008333452) * fStack_b84 + 0.041665796) * fStack_b84 + 0.16666666) *
                            fStack_b84 + 0.5) * fStack_b84 * fStack_b84 + fStack_b84 + 1.0) *
                          fStack_bb4,
                          ((((((fStack_b88 * 0.00019875691 + 0.0013981999) * fStack_b88 +
                              0.008333452) * fStack_b88 + 0.041665796) * fStack_b88 + 0.16666666) *
                            fStack_b88 + 0.5) * fStack_b88 * fStack_b88 + fStack_b88 + 1.0) *
                          fStack_bb8);
    *local_27a0 = local_c90;
    local_27a0[1] = uStack_c88;
    local_2790 = local_2790 + 2;
    local_27a0 = local_27a0 + 2;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_b(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

    const int size = w * elempack;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _b_avx512 = _mm512_set1_ps(*ptr1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_avx512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _b_avx = _mm256_set1_ps(*ptr1);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_avx);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _b = _mm_set1_ps(*ptr1);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
}